

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O2

Spectrum __thiscall CMU462::PathTracer::raytrace_pixel(PathTracer *this,size_t x,size_t y)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined4 uVar13;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 uVar16;
  undefined1 auVar15 [16];
  undefined4 uVar18;
  undefined1 auVar17 [16];
  Spectrum SVar19;
  Spectrum local_118;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  Ray local_90;
  undefined4 uVar14;
  
  iVar1 = (int)this->ns_aa;
  sVar2 = (this->sampleBuffer).w;
  sVar3 = (this->sampleBuffer).h;
  uVar13 = (undefined4)(x >> 0x20);
  uVar14 = (undefined4)(sVar2 >> 0x20);
  uVar18 = (undefined4)(y >> 0x20);
  uVar16 = (undefined4)(sVar3 >> 0x20);
  if (iVar1 == 1) {
    auVar11._8_4_ = uVar13;
    auVar11._0_8_ = x;
    auVar11._12_4_ = 0x45300000;
    auVar12._8_4_ = uVar14;
    auVar12._0_8_ = sVar2;
    auVar12._12_4_ = 0x45300000;
    auVar17._8_4_ = uVar18;
    auVar17._0_8_ = y;
    auVar17._12_4_ = 0x45300000;
    auVar15._8_4_ = uVar16;
    auVar15._0_8_ = sVar3;
    auVar15._12_4_ = 0x45300000;
    Camera::generate_ray
              (&local_90,this->camera,
               ((auVar11._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)x) - 4503599627370496.0) + 0.5) /
               ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) + -0.5,
               ((auVar17._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)y) - 4503599627370496.0) + 0.5) /
               ((auVar15._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) + -0.5);
    SVar19 = trace_ray(this,&local_90);
  }
  else {
    local_118 = (Spectrum)ZEXT812(0);
    auVar6._8_4_ = uVar13;
    auVar6._0_8_ = x;
    auVar6._12_4_ = 0x45300000;
    dStack_b0 = auVar6._8_8_ - 1.9342813113834067e+25;
    local_b8 = dStack_b0 + ((double)CONCAT44(0x43300000,(int)x) - 4503599627370496.0);
    auVar7._8_4_ = uVar14;
    auVar7._0_8_ = sVar2;
    auVar7._12_4_ = 0x45300000;
    dStack_c0 = auVar7._8_8_ - 1.9342813113834067e+25;
    local_c8 = dStack_c0 + ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
    auVar8._8_4_ = uVar18;
    auVar8._0_8_ = y;
    auVar8._12_4_ = 0x45300000;
    dStack_d0 = auVar8._8_8_ - 1.9342813113834067e+25;
    local_d8 = dStack_d0 + ((double)CONCAT44(0x43300000,(int)y) - 4503599627370496.0);
    auVar9._8_4_ = uVar16;
    auVar9._0_8_ = sVar3;
    auVar9._12_4_ = 0x45300000;
    dStack_e0 = auVar9._8_8_ - 1.9342813113834067e+25;
    local_108 = (float)(1.0 / (double)iVar1);
    local_f8 = CONCAT44((int)((ulong)(double)iVar1 >> 0x20),local_108);
    iVar4 = 0;
    if (0 < iVar1) {
      iVar4 = iVar1;
    }
    local_e8 = dStack_e0 + ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
    uStack_f0 = 0;
    fVar10 = 0.0;
    _local_a8 = ZEXT816(0);
    fStack_104 = local_108;
    fStack_100 = local_108;
    fStack_fc = local_108;
    while( true ) {
      SVar19.b = fVar10;
      SVar19.r = (float)(int)local_a8;
      SVar19.g = (float)(int)((ulong)local_a8 >> 0x20);
      bVar5 = iVar4 == 0;
      iVar4 = iVar4 + -1;
      if (bVar5) break;
      (*this->gridSampler->_vptr_Sampler2D[2])(&local_90);
      Camera::generate_ray
                (&local_90,this->camera,((double)local_90.depth + local_b8) / local_c8 + -0.5,
                 (local_90.o.x + local_d8) / local_e8 + -0.5);
      local_118 = trace_ray(this,&local_90);
      Spectrum::clampRGB(&local_118,10.0);
      local_a8._0_4_ = (float)local_a8._0_4_ + local_118.r * local_108;
      local_a8._4_4_ = (float)local_a8._4_4_ + local_118.g * fStack_104;
      fStack_a0 = fStack_a0 + fStack_100 * 0.0;
      fStack_9c = fStack_9c + fStack_fc * 0.0;
      fVar10 = fVar10 + local_118.b * (float)local_f8;
    }
  }
  return SVar19;
}

Assistant:

Spectrum PathTracer::raytrace_pixel(size_t x, size_t y) {
	// TODO (PathTracer):
	// Sample the pixel with coordinate (x,y) and return the result spectrum.
	// The sample rate is given by the number of camera rays per pixel.

	int num_samples = ns_aa;

	size_t w = sampleBuffer.w;
	size_t h = sampleBuffer.h;

	if (num_samples == 1) {
		Vector2D p = Vector2D((double(x)+0.5) / w, (double(y)+0.5) / h);
		return trace_ray(camera->generate_ray(p.x-0.5, p.y-0.5));
	}
	else {
		Vector2D p;
		double a1, a2;
		Spectrum result(0, 0, 0);
		Spectrum temp;
		for (int i = 0; i < num_samples; i++) {
			p = gridSampler->get_sample();
			a1 = (double(x) + p.x) / w;
			a2 = (double(y) + p.y) / h;
			temp = trace_ray(camera->generate_ray(a1 - 0.5, a2 - 0.5));
			temp.clampRGB(10.0);
			result += temp * (1.0 / num_samples);
		}
		return result;
	}
}